

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O0

int mbedtls_pem_read_buffer
              (mbedtls_pem_context *ctx,char *header,char *footer,uchar *data,uchar *pwd,
              size_t pwdlen,size_t *use_len)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  size_t sVar4;
  int local_8c;
  uchar local_88 [4];
  mbedtls_cipher_type_t enc_alg;
  uchar pem_iv [16];
  uchar *local_70;
  uchar *end;
  uchar *s2;
  uchar *s1;
  uchar *buf;
  size_t len;
  int enc;
  int ret;
  size_t pwdlen_local;
  uchar *pwd_local;
  uchar *data_local;
  char *footer_local;
  char *header_local;
  mbedtls_pem_context *ctx_local;
  
  local_8c = 0;
  if (ctx == (mbedtls_pem_context *)0x0) {
    ctx_local._4_4_ = -0x1480;
  }
  else {
    _enc = pwdlen;
    pwdlen_local = (size_t)pwd;
    pwd_local = data;
    data_local = (uchar *)footer;
    footer_local = header;
    header_local = (char *)ctx;
    puVar2 = (uchar *)strstr((char *)data,header);
    if (puVar2 == (uchar *)0x0) {
      ctx_local._4_4_ = -0x1080;
    }
    else {
      puVar3 = (uchar *)strstr((char *)pwd_local,(char *)data_local);
      if ((puVar3 == (uchar *)0x0) || (puVar3 <= puVar2)) {
        ctx_local._4_4_ = -0x1080;
      }
      else {
        sVar4 = strlen(footer_local);
        s2 = puVar2 + sVar4;
        if (*s2 == ' ') {
          s2 = s2 + 1;
        }
        if (*s2 == '\r') {
          s2 = s2 + 1;
        }
        if (*s2 == '\n') {
          puVar2 = s2 + 1;
          sVar4 = strlen((char *)data_local);
          local_70 = puVar3 + sVar4;
          if (*local_70 == ' ') {
            local_70 = local_70 + 1;
          }
          if (*local_70 == '\r') {
            local_70 = local_70 + 1;
          }
          if (*local_70 == '\n') {
            local_70 = local_70 + 1;
          }
          *use_len = (long)local_70 - (long)pwd_local;
          len._0_4_ = 0;
          if ((0x15 < (long)puVar3 - (long)puVar2) &&
             (iVar1 = memcmp(puVar2,"Proc-Type: 4,ENCRYPTED",0x16), iVar1 == 0)) {
            len._0_4_ = (int)len + 1;
            puVar2 = s2 + 0x17;
            if (s2[0x17] == '\r') {
              puVar2 = s2 + 0x18;
            }
            s2 = puVar2;
            if (*s2 != '\n') {
              return -0x1100;
            }
            puVar2 = s2 + 1;
            if (((long)puVar3 - (long)puVar2 < 0x17) ||
               (iVar1 = memcmp(puVar2,"DEK-Info: DES-EDE3-CBC,",0x17), iVar1 != 0)) {
              if ((0x11 < (long)puVar3 - (long)puVar2) &&
                 (iVar1 = memcmp(puVar2,"DEK-Info: DES-CBC,",0x12), iVar1 == 0)) {
                local_8c = 0x21;
                if (((long)puVar3 - (long)(s2 + 0x13) < 0x10) ||
                   (iVar1 = pem_get_iv(s2 + 0x13,local_88,8), iVar1 != 0)) {
                  return -0x1200;
                }
                puVar2 = s2 + 0x23;
              }
            }
            else {
              local_8c = 0x25;
              if (((long)puVar3 - (long)(s2 + 0x18) < 0x10) ||
                 (iVar1 = pem_get_iv(s2 + 0x18,local_88,8), iVar1 != 0)) {
                return -0x1200;
              }
              puVar2 = s2 + 0x28;
            }
            s2 = puVar2;
            if ((0xd < (long)puVar3 - (long)s2) &&
               (iVar1 = memcmp(s2,"DEK-Info: AES-",0xe), iVar1 == 0)) {
              if ((long)puVar3 - (long)s2 < 0x16) {
                return -0x1280;
              }
              iVar1 = memcmp(s2,"DEK-Info: AES-128-CBC,",0x16);
              if (iVar1 == 0) {
                local_8c = 5;
              }
              else {
                iVar1 = memcmp(s2,"DEK-Info: AES-192-CBC,",0x16);
                if (iVar1 == 0) {
                  local_8c = 6;
                }
                else {
                  iVar1 = memcmp(s2,"DEK-Info: AES-256-CBC,",0x16);
                  if (iVar1 != 0) {
                    return -0x1280;
                  }
                  local_8c = 7;
                }
              }
              if (((long)puVar3 - (long)(s2 + 0x16) < 0x20) ||
                 (iVar1 = pem_get_iv(s2 + 0x16,local_88,0x10), iVar1 != 0)) {
                return -0x1200;
              }
              s2 = s2 + 0x36;
            }
            if (local_8c == 0) {
              return -0x1280;
            }
            if (*s2 == '\r') {
              s2 = s2 + 1;
            }
            if (*s2 != '\n') {
              return -0x1100;
            }
            puVar2 = s2 + 1;
          }
          s2 = puVar2;
          if (s2 < puVar3) {
            len._4_4_ = mbedtls_base64_decode
                                  ((uchar *)0x0,0,(size_t *)&buf,s2,(long)puVar3 - (long)s2);
            if (len._4_4_ == -0x2c) {
              ctx_local._4_4_ = -0x112c;
            }
            else {
              puVar2 = (uchar *)calloc(1,(size_t)buf);
              if (puVar2 == (uchar *)0x0) {
                ctx_local._4_4_ = -0x1180;
              }
              else {
                len._4_4_ = mbedtls_base64_decode
                                      (puVar2,(size_t)buf,(size_t *)&buf,s2,(long)puVar3 - (long)s2)
                ;
                if (len._4_4_ == 0) {
                  if ((int)len != 0) {
                    if (pwdlen_local == 0) {
                      mbedtls_platform_zeroize(puVar2,(size_t)buf);
                      free(puVar2);
                      return -0x1300;
                    }
                    len._4_4_ = 0;
                    if (local_8c == 0x25) {
                      len._4_4_ = pem_des3_decrypt(local_88,puVar2,(size_t)buf,(uchar *)pwdlen_local
                                                   ,_enc);
                    }
                    else if (local_8c == 0x21) {
                      len._4_4_ = pem_des_decrypt(local_88,puVar2,(size_t)buf,(uchar *)pwdlen_local,
                                                  _enc);
                    }
                    if (local_8c == 5) {
                      len._4_4_ = pem_aes_decrypt(local_88,0x10,puVar2,(size_t)buf,
                                                  (uchar *)pwdlen_local,_enc);
                    }
                    else if (local_8c == 6) {
                      len._4_4_ = pem_aes_decrypt(local_88,0x18,puVar2,(size_t)buf,
                                                  (uchar *)pwdlen_local,_enc);
                    }
                    else if (local_8c == 7) {
                      len._4_4_ = pem_aes_decrypt(local_88,0x20,puVar2,(size_t)buf,
                                                  (uchar *)pwdlen_local,_enc);
                    }
                    if (len._4_4_ != 0) {
                      free(puVar2);
                      return len._4_4_;
                    }
                    if (((buf < (uchar *)0x3) || (*puVar2 != '0')) || (0x83 < puVar2[1])) {
                      mbedtls_platform_zeroize(puVar2,(size_t)buf);
                      free(puVar2);
                      return -0x1380;
                    }
                  }
                  *(uchar **)header_local = puVar2;
                  *(uchar **)(header_local + 8) = buf;
                  ctx_local._4_4_ = 0;
                }
                else {
                  mbedtls_platform_zeroize(puVar2,(size_t)buf);
                  free(puVar2);
                  ctx_local._4_4_ = len._4_4_ + -0x1100;
                }
              }
            }
          }
          else {
            ctx_local._4_4_ = -0x1100;
          }
        }
        else {
          ctx_local._4_4_ = -0x1080;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_pem_read_buffer( mbedtls_pem_context *ctx, const char *header, const char *footer,
                     const unsigned char *data, const unsigned char *pwd,
                     size_t pwdlen, size_t *use_len )
{
    int ret, enc;
    size_t len;
    unsigned char *buf;
    const unsigned char *s1, *s2, *end;
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
    unsigned char pem_iv[16];
    mbedtls_cipher_type_t enc_alg = MBEDTLS_CIPHER_NONE;
#else
    ((void) pwd);
    ((void) pwdlen);
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */

    if( ctx == NULL )
        return( MBEDTLS_ERR_PEM_BAD_INPUT_DATA );

    s1 = (unsigned char *) strstr( (const char *) data, header );

    if( s1 == NULL )
        return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    s2 = (unsigned char *) strstr( (const char *) data, footer );

    if( s2 == NULL || s2 <= s1 )
        return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    s1 += strlen( header );
    if( *s1 == ' '  ) s1++;
    if( *s1 == '\r' ) s1++;
    if( *s1 == '\n' ) s1++;
    else return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    end = s2;
    end += strlen( footer );
    if( *end == ' '  ) end++;
    if( *end == '\r' ) end++;
    if( *end == '\n' ) end++;
    *use_len = end - data;

    enc = 0;

    if( s2 - s1 >= 22 && memcmp( s1, "Proc-Type: 4,ENCRYPTED", 22 ) == 0 )
    {
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
        enc++;

        s1 += 22;
        if( *s1 == '\r' ) s1++;
        if( *s1 == '\n' ) s1++;
        else return( MBEDTLS_ERR_PEM_INVALID_DATA );


#if defined(MBEDTLS_DES_C)
        if( s2 - s1 >= 23 && memcmp( s1, "DEK-Info: DES-EDE3-CBC,", 23 ) == 0 )
        {
            enc_alg = MBEDTLS_CIPHER_DES_EDE3_CBC;

            s1 += 23;
            if( s2 - s1 < 16 || pem_get_iv( s1, pem_iv, 8 ) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 16;
        }
        else if( s2 - s1 >= 18 && memcmp( s1, "DEK-Info: DES-CBC,", 18 ) == 0 )
        {
            enc_alg = MBEDTLS_CIPHER_DES_CBC;

            s1 += 18;
            if( s2 - s1 < 16 || pem_get_iv( s1, pem_iv, 8) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 16;
        }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if( s2 - s1 >= 14 && memcmp( s1, "DEK-Info: AES-", 14 ) == 0 )
        {
            if( s2 - s1 < 22 )
                return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );
            else if( memcmp( s1, "DEK-Info: AES-128-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_128_CBC;
            else if( memcmp( s1, "DEK-Info: AES-192-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_192_CBC;
            else if( memcmp( s1, "DEK-Info: AES-256-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_256_CBC;
            else
                return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );

            s1 += 22;
            if( s2 - s1 < 32 || pem_get_iv( s1, pem_iv, 16 ) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 32;
        }
#endif /* MBEDTLS_AES_C */

        if( enc_alg == MBEDTLS_CIPHER_NONE )
            return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );

        if( *s1 == '\r' ) s1++;
        if( *s1 == '\n' ) s1++;
        else return( MBEDTLS_ERR_PEM_INVALID_DATA );
#else
        return( MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE );
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */
    }

    if( s1 >= s2 )
        return( MBEDTLS_ERR_PEM_INVALID_DATA );

    ret = mbedtls_base64_decode( NULL, 0, &len, s1, s2 - s1 );

    if( ret == MBEDTLS_ERR_BASE64_INVALID_CHARACTER )
        return( MBEDTLS_ERR_PEM_INVALID_DATA + ret );

    if( ( buf = mbedtls_calloc( 1, len ) ) == NULL )
        return( MBEDTLS_ERR_PEM_ALLOC_FAILED );

    if( ( ret = mbedtls_base64_decode( buf, len, &len, s1, s2 - s1 ) ) != 0 )
    {
        mbedtls_platform_zeroize( buf, len );
        mbedtls_free( buf );
        return( MBEDTLS_ERR_PEM_INVALID_DATA + ret );
    }

    if( enc != 0 )
    {
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
        if( pwd == NULL )
        {
            mbedtls_platform_zeroize( buf, len );
            mbedtls_free( buf );
            return( MBEDTLS_ERR_PEM_PASSWORD_REQUIRED );
        }

        ret = 0;

#if defined(MBEDTLS_DES_C)
        if( enc_alg == MBEDTLS_CIPHER_DES_EDE3_CBC )
            ret = pem_des3_decrypt( pem_iv, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_DES_CBC )
            ret = pem_des_decrypt( pem_iv, buf, len, pwd, pwdlen );
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if( enc_alg == MBEDTLS_CIPHER_AES_128_CBC )
            ret = pem_aes_decrypt( pem_iv, 16, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_AES_192_CBC )
            ret = pem_aes_decrypt( pem_iv, 24, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_AES_256_CBC )
            ret = pem_aes_decrypt( pem_iv, 32, buf, len, pwd, pwdlen );
#endif /* MBEDTLS_AES_C */

        if( ret != 0 )
        {
            mbedtls_free( buf );
            return( ret );
        }

        /*
         * The result will be ASN.1 starting with a SEQUENCE tag, with 1 to 3
         * length bytes (allow 4 to be sure) in all known use cases.
         *
         * Use that as a heuristic to try to detect password mismatches.
         */
        if( len <= 2 || buf[0] != 0x30 || buf[1] > 0x83 )
        {
            mbedtls_platform_zeroize( buf, len );
            mbedtls_free( buf );
            return( MBEDTLS_ERR_PEM_PASSWORD_MISMATCH );
        }
#else
        mbedtls_platform_zeroize( buf, len );
        mbedtls_free( buf );
        return( MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE );
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */
    }

    ctx->buf = buf;
    ctx->buflen = len;

    return( 0 );
}